

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# persistence.h
# Opt level: O0

void __thiscall
persistence_computer_t<directed_flag_complex_computer::directed_flag_complex_computer_t>::
assemble_columns_to_reduce
          (persistence_computer_t<directed_flag_complex_computer::directed_flag_complex_computer_t>
           *this,index_t dimension,pivot_column_index_t *pivot_column_index)

{
  int iVar1;
  size_t sVar2;
  ostream *poVar3;
  reference pvVar4;
  pair<float,_int> p;
  size_type sVar5;
  long in_RDI;
  value_t vVar6;
  value_t filtration;
  index_t index;
  index_t num_cells;
  undefined4 in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  directed_flag_complex_computer_t *in_stack_ffffffffffffffb0;
  directed_flag_complex_computer_t *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffd0;
  float in_stack_ffffffffffffffd4;
  int local_20;
  
  sVar2 = directed_flag_complex_computer::directed_flag_complex_computer_t::number_of_cells
                    (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
  iVar1 = (int)sVar2;
  std::deque<filtration_index_t,_std::allocator<filtration_index_t>_>::clear
            ((deque<filtration_index_t,_std::allocator<filtration_index_t>_> *)
             CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  poVar3 = std::operator<<((ostream *)&std::cout,"\x1b[K");
  poVar3 = std::operator<<(poVar3,"assembling ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar1);
  poVar3 = std::operator<<(poVar3," columns");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::flush<char,std::char_traits<char>>);
  std::operator<<(poVar3,"\r");
  for (local_20 = 0; local_20 < iVar1; local_20 = local_20 + 1) {
    pvVar4 = std::deque<int,_std::allocator<int>_>::operator[]
                       ((deque<int,_std::allocator<int>_> *)in_stack_ffffffffffffffb0,
                        CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    if (*pvVar4 == 0x7fffffff) {
      vVar6 = directed_flag_complex_computer::directed_flag_complex_computer_t::filtration
                        (in_stack_ffffffffffffffb8,(int)((ulong)in_stack_ffffffffffffffb0 >> 0x20),
                         (index_t)in_stack_ffffffffffffffb0);
      if (vVar6 <= *(float *)(in_RDI + 0x10)) {
        in_stack_ffffffffffffffb8 = (directed_flag_complex_computer_t *)(in_RDI + 0x40);
        p = std::make_pair<float&,int&>
                      ((float *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                       (int *)0x1da8c9);
        filtration_index_t::filtration_index_t((filtration_index_t *)&stack0xffffffffffffffd4,p);
        std::deque<filtration_index_t,_std::allocator<filtration_index_t>_>::push_back
                  ((deque<filtration_index_t,_std::allocator<filtration_index_t>_> *)
                   in_stack_ffffffffffffffb0,
                   (value_type *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
      }
      if ((local_20 + 1) % 100000 == 0) {
        poVar3 = std::operator<<((ostream *)&std::cout,"\x1b[K");
        in_stack_ffffffffffffffb0 =
             (directed_flag_complex_computer_t *)std::operator<<(poVar3,"assembled ");
        sVar5 = std::deque<filtration_index_t,_std::allocator<filtration_index_t>_>::size
                          ((deque<filtration_index_t,_std::allocator<filtration_index_t>_> *)
                           0x1da939);
        poVar3 = (ostream *)std::ostream::operator<<(in_stack_ffffffffffffffb0,sVar5);
        poVar3 = std::operator<<(poVar3," out of ");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_20 + 1);
        poVar3 = std::operator<<(poVar3,"/");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar1);
        poVar3 = std::operator<<(poVar3," columns");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::flush<char,std::char_traits<char>>)
        ;
        std::operator<<(poVar3,"\r");
      }
    }
  }
  std::operator<<((ostream *)&std::cout,"\x1b[K");
  return;
}

Assistant:

void assemble_columns_to_reduce(index_t dimension, pivot_column_index_t& pivot_column_index) {
		index_t num_cells = index_t(complex.number_of_cells(dimension + 1));

		columns_to_reduce.clear();

#ifdef INDICATE_PROGRESS
		std::cout << "\033[K"
		          << "assembling " << num_cells << " columns" << std::flush << "\r";
#endif

		for (index_t index = 0; index < num_cells; ++index) {
			if (
#ifdef USE_ARRAY_HASHMAP
			    pivot_column_index[index] == INVALID_INDEX
#else
			    pivot_column_index.find(index) == pivot_column_index.end()
#endif
			) {
				value_t filtration = complex.filtration(dimension + 1, index);
				if (filtration <= max_filtration) { columns_to_reduce.push_back(std::make_pair(filtration, index)); }
#ifdef INDICATE_PROGRESS
				if ((index + 1) % 100000 == 0)
					std::cout << "\033[K"
					          << "assembled " << columns_to_reduce.size() << " out of " << (index + 1) << "/"
					          << num_cells << " columns" << std::flush << "\r";
#endif
			}
		}
#ifdef INDICATE_PROGRESS
		std::cout << "\033[K";
#endif
	}